

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void dequant_comp(j_decompress_ptr cinfo,jpeg_component_info *compptr,jvirt_barray_ptr coef_array,
                 JQUANT_TBL *qtblptr1)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  JQUANT_TBL *pJVar4;
  JBLOCKARRAY ppaJVar5;
  JDIMENSION JVar6;
  long lVar7;
  JBLOCKROW paJVar8;
  ulong uVar9;
  long lVar10;
  
  if (compptr->height_in_blocks != 0) {
    pJVar4 = compptr->quant_table;
    JVar6 = 0;
    do {
      ppaJVar5 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,coef_array,JVar6,compptr->v_samp_factor,1);
      iVar2 = compptr->v_samp_factor;
      if (0 < (long)iVar2) {
        uVar3 = compptr->width_in_blocks;
        lVar7 = 0;
        do {
          if ((ulong)uVar3 != 0) {
            paJVar8 = ppaJVar5[lVar7];
            uVar9 = 0;
            do {
              lVar10 = 0;
              do {
                uVar1 = pJVar4->quantval[lVar10];
                if (uVar1 != qtblptr1->quantval[lVar10]) {
                  (*paJVar8)[lVar10] = (uVar1 / qtblptr1->quantval[lVar10]) * (*paJVar8)[lVar10];
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != 0x40);
              uVar9 = uVar9 + 1;
              paJVar8 = paJVar8 + 1;
            } while (uVar9 != uVar3);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar2);
      }
      JVar6 = iVar2 + JVar6;
    } while (JVar6 < compptr->height_in_blocks);
  }
  return;
}

Assistant:

LOCAL(void)
dequant_comp(j_decompress_ptr cinfo, jpeg_component_info *compptr,
             jvirt_barray_ptr coef_array, JQUANT_TBL *qtblptr1)
{
  JDIMENSION blk_x, blk_y;
  int offset_y, k;
  JQUANT_TBL *qtblptr;
  JBLOCKARRAY buffer;
  JBLOCKROW block;
  JCOEFPTR ptr;

  qtblptr = compptr->quant_table;
  for (blk_y = 0; blk_y < compptr->height_in_blocks;
       blk_y += compptr->v_samp_factor) {
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef_array, blk_y,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
      block = buffer[offset_y];
      for (blk_x = 0; blk_x < compptr->width_in_blocks; blk_x++) {
        ptr = block[blk_x];
        for (k = 0; k < DCTSIZE2; k++)
          if (qtblptr->quantval[k] != qtblptr1->quantval[k])
            ptr[k] *= qtblptr->quantval[k] / qtblptr1->quantval[k];
      }
    }
  }
}